

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_data_layout.h
# Opt level: O3

void __thiscall
dlib::row_major_layout::
layout<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5>::set_size
          (layout<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5> *this,
          size_t nr,size_t nc)

{
  undefined1 auVar1 [16];
  rgb_pixel *prVar2;
  ulong uVar3;
  
  if (this->data != (rgb_pixel *)0x0) {
    operator_delete__(this->data);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = nc * nr;
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(3),8) == 0) {
    uVar3 = SUB168(auVar1 * ZEXT816(3),0);
  }
  prVar2 = (rgb_pixel *)operator_new__(uVar3);
  this->data = prVar2;
  this->nr_ = nr;
  this->nc_ = nc;
  return;
}

Assistant:

void set_size (
                size_t nr,
                size_t nc
            )
            {
                if (data) 
                {
                    pool.deallocate_array(data);
                }
                data = pool.allocate_array(nr*nc);
                nr_ = nr;
                nc_ = nc;
            }